

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

bool __thiscall HyperLogLog::WriteHyperLogLog(HyperLogLog *this,FILE *F)

{
  int iVar1;
  bool bVar2;
  int i;
  long lVar3;
  
  Assess(this);
  iVar1 = fprintf((FILE *)F,"%f");
  bVar2 = 0 < iVar1;
  lVar3 = 0;
  do {
    iVar1 = fprintf((FILE *)F,",%u",(ulong)this->hllv[lVar3]);
    bVar2 = (bool)(bVar2 & 0 < iVar1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return bVar2;
}

Assistant:

bool HyperLogLog::WriteHyperLogLog(FILE* F)
{
    double E = Assess();
    bool ret = (fprintf(F, "%f", E) > 0);
    for (int i = 0; i < 16; i++) {
        ret &= (fprintf(F, ",%u", hllv[i]) > 0);
    }
    return ret;
}